

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::arrayLimitCheck
          (TParseContext *this,TSourceLoc *loc,TString *identifier,int size)

{
  int iVar1;
  char *limit;
  char *feature;
  
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(identifier,"gl_TexCoord");
  if (iVar1 == 0) {
    limit = "gl_MaxTextureCoords";
    feature = "gl_TexCoord array size";
  }
  else {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(identifier,"gl_ClipDistance");
    if (iVar1 == 0) {
      limit = "gl_MaxClipDistances";
      feature = "gl_ClipDistance array size";
    }
    else {
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (identifier,"gl_CullDistance");
      if (iVar1 == 0) {
        limit = "gl_MaxCullDistances";
        feature = "gl_CullDistance array size";
      }
      else {
        iVar1 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (identifier,"gl_ClipDistancePerViewNV");
        if (iVar1 == 0) {
          limit = "gl_MaxClipDistances";
          feature = "gl_ClipDistancePerViewNV array size";
        }
        else {
          iVar1 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(identifier,"gl_CullDistancePerViewNV");
          if (iVar1 != 0) {
            return;
          }
          limit = "gl_MaxCullDistances";
          feature = "gl_CullDistancePerViewNV array size";
        }
      }
    }
  }
  limitCheck(this,loc,size,limit,feature);
  return;
}

Assistant:

void TParseContext::arrayLimitCheck(const TSourceLoc& loc, const TString& identifier, int size)
{
    if (identifier.compare("gl_TexCoord") == 0)
        limitCheck(loc, size, "gl_MaxTextureCoords", "gl_TexCoord array size");
    else if (identifier.compare("gl_ClipDistance") == 0)
        limitCheck(loc, size, "gl_MaxClipDistances", "gl_ClipDistance array size");
    else if (identifier.compare("gl_CullDistance") == 0)
        limitCheck(loc, size, "gl_MaxCullDistances", "gl_CullDistance array size");
    else if (identifier.compare("gl_ClipDistancePerViewNV") == 0)
        limitCheck(loc, size, "gl_MaxClipDistances", "gl_ClipDistancePerViewNV array size");
    else if (identifier.compare("gl_CullDistancePerViewNV") == 0)
        limitCheck(loc, size, "gl_MaxCullDistances", "gl_CullDistancePerViewNV array size");
}